

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileTargetGenerator.cxx
# Opt level: O0

void __thiscall
cmMakefileTargetGenerator::CreateObjectLists
          (cmMakefileTargetGenerator *this,bool useLinkScript,bool useArchiveRules,
          bool useResponseFile,string *buildObjs,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *makefile_depends,bool useWatcomQuote)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  size_type sVar1;
  reference pvVar2;
  undefined1 local_180 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  objStrings;
  undefined1 local_148 [8];
  string objects_rsp;
  char rsp [32];
  uint local_fc;
  char *pcStack_f8;
  uint i;
  char *sep;
  char *responseFlag;
  allocator local_c1;
  undefined1 local_c0 [8];
  string responseFlagVar;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  object_strings;
  size_type responseFileLimit;
  undefined1 local_70 [8];
  string variableNameExternal;
  string variableName;
  bool useWatcomQuote_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *makefile_depends_local;
  string *buildObjs_local;
  bool useResponseFile_local;
  bool useArchiveRules_local;
  bool useLinkScript_local;
  cmMakefileTargetGenerator *this_local;
  
  std::__cxx11::string::string((string *)(variableNameExternal.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)local_70);
  WriteObjectsVariable
            (this,(string *)(variableNameExternal.field_2._M_local_buf + 8),(string *)local_70,
             useWatcomQuote);
  if (useResponseFile) {
    this_00 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((long)&responseFlagVar.field_2 + 8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(this_00);
    WriteObjectsStrings(this,this_00,0x1ffb8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)local_c0,"CMAKE_",&local_c1);
    std::allocator<char>::~allocator((allocator<char> *)&local_c1);
    cmGeneratorTarget::GetLinkerLanguage
              ((string *)&responseFlag,(this->super_cmCommonTargetGenerator).GeneratorTarget,
               &(this->super_cmCommonTargetGenerator).ConfigName);
    std::__cxx11::string::operator+=((string *)local_c0,(string *)&responseFlag);
    std::__cxx11::string::~string((string *)&responseFlag);
    std::__cxx11::string::operator+=((string *)local_c0,"_RESPONSE_FILE_LINK_FLAG");
    sep = cmMakefile::GetDefinition
                    ((this->super_cmCommonTargetGenerator).Makefile,(string *)local_c0);
    if (sep == (char *)0x0) {
      sep = "@";
    }
    pcStack_f8 = "";
    for (local_fc = 0;
        sVar1 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)((long)&responseFlagVar.field_2 + 8)), local_fc < sVar1;
        local_fc = local_fc + 1) {
      sprintf(objects_rsp.field_2._M_local_buf + 8,"objects%u.rsp",(ulong)(local_fc + 1));
      pvVar2 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)((long)&responseFlagVar.field_2 + 8),(ulong)local_fc);
      CreateResponseFile((string *)local_148,this,objects_rsp.field_2._M_local_buf + 8,pvVar2,
                         makefile_depends);
      std::__cxx11::string::operator+=((string *)buildObjs,pcStack_f8);
      pcStack_f8 = " ";
      std::__cxx11::string::operator+=((string *)buildObjs,sep);
      cmOutputConverter::ConvertToOutputFormat
                ((string *)
                 &objStrings.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,
                 &(this->LocalGenerator->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                  super_cmOutputConverter,(string *)local_148,SHELL);
      std::__cxx11::string::operator+=
                ((string *)buildObjs,
                 (string *)
                 &objStrings.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::__cxx11::string::~string
                ((string *)
                 &objStrings.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::__cxx11::string::~string((string *)local_148);
    }
    std::__cxx11::string::~string((string *)local_c0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((long)&responseFlagVar.field_2 + 8));
  }
  else if (useLinkScript) {
    if (!useArchiveRules) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_180);
      WriteObjectsStrings(this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)local_180,0xffffffffffffffff);
      pvVar2 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_180,0);
      std::__cxx11::string::operator=((string *)buildObjs,(string *)pvVar2);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_180);
    }
  }
  else {
    std::__cxx11::string::operator=((string *)buildObjs,"$(");
    std::__cxx11::string::operator+=
              ((string *)buildObjs,(string *)(variableNameExternal.field_2._M_local_buf + 8));
    std::__cxx11::string::operator+=((string *)buildObjs,") $(");
    std::__cxx11::string::operator+=((string *)buildObjs,(string *)local_70);
    std::__cxx11::string::operator+=((string *)buildObjs,")");
  }
  std::__cxx11::string::~string((string *)local_70);
  std::__cxx11::string::~string((string *)(variableNameExternal.field_2._M_local_buf + 8));
  return;
}

Assistant:

void cmMakefileTargetGenerator::CreateObjectLists(
  bool useLinkScript, bool useArchiveRules, bool useResponseFile,
  std::string& buildObjs, std::vector<std::string>& makefile_depends,
  bool useWatcomQuote)
{
  std::string variableName;
  std::string variableNameExternal;
  this->WriteObjectsVariable(variableName, variableNameExternal,
                             useWatcomQuote);
  if (useResponseFile) {
    // MSVC response files cannot exceed 128K.
    std::string::size_type const responseFileLimit = 131000;

    // Construct the individual object list strings.
    std::vector<std::string> object_strings;
    this->WriteObjectsStrings(object_strings, responseFileLimit);

    // Lookup the response file reference flag.
    std::string responseFlagVar = "CMAKE_";
    responseFlagVar +=
      this->GeneratorTarget->GetLinkerLanguage(this->ConfigName);
    responseFlagVar += "_RESPONSE_FILE_LINK_FLAG";
    const char* responseFlag = this->Makefile->GetDefinition(responseFlagVar);
    if (!responseFlag) {
      responseFlag = "@";
    }

    // Write a response file for each string.
    const char* sep = "";
    for (unsigned int i = 0; i < object_strings.size(); ++i) {
      // Number the response files.
      char rsp[32];
      sprintf(rsp, "objects%u.rsp", i + 1);

      // Create this response file.
      std::string objects_rsp =
        this->CreateResponseFile(rsp, object_strings[i], makefile_depends);

      // Separate from previous response file references.
      buildObjs += sep;
      sep = " ";

      // Reference the response file.
      buildObjs += responseFlag;
      buildObjs += this->LocalGenerator->ConvertToOutputFormat(
        objects_rsp, cmOutputConverter::SHELL);
    }
  } else if (useLinkScript) {
    if (!useArchiveRules) {
      std::vector<std::string> objStrings;
      this->WriteObjectsStrings(objStrings);
      buildObjs = objStrings[0];
    }
  } else {
    buildObjs = "$(";
    buildObjs += variableName;
    buildObjs += ") $(";
    buildObjs += variableNameExternal;
    buildObjs += ")";
  }
}